

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::setOptionValue(Highs *this,string *option,char *value)

{
  OptionStatus OVar1;
  HighsLogOptions *in_RDX;
  Highs *in_RSI;
  HighsLogOptions *in_RDI;
  HighsLogOptions report_log_options;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffffd0;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  HighsLogOptions::HighsLogOptions
            (in_RDI,(HighsLogOptions *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
            );
  OVar1 = setLocalOptionValue(in_RDI,(string *)in_RSI,in_RDX,in_stack_ffffffffffffffd8,
                              in_stack_ffffffffffffffd0);
  if (OVar1 == kOk) {
    local_4 = optionChangeAction(in_RSI);
  }
  else {
    local_4 = kError;
  }
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x483ced);
  return local_4;
}

Assistant:

HighsStatus Highs::setOptionValue(const std::string& option,
                                  const char* value) {
  HighsLogOptions report_log_options = options_.log_options;
  if (setLocalOptionValue(report_log_options, option, options_.log_options,
                          options_.records, value) == OptionStatus::kOk)
    return optionChangeAction();
  return HighsStatus::kError;
}